

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

void speak_file(OpenJTalk *openjtalk,FILE *fp)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *in_RSI;
  undefined8 in_RDI;
  char line [1001];
  char acStack_408 [1016];
  FILE *local_10;
  undefined8 local_8;
  
  if (in_RSI != (FILE *)0x0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    uVar1 = getc(in_RSI);
    if ((((uVar1 & 0xff) != 0xef) || (uVar1 = getc(local_10), (uVar1 & 0xff) != 0xbb)) ||
       (uVar1 = getc(local_10), (uVar1 & 0xff) != 0xbf)) {
      fseek(local_10,0,0);
    }
    while (pcVar2 = fgets(acStack_408,0x104,local_10), pcVar2 != (char *)0x0) {
      remove_cr_lf(acStack_408);
      sVar3 = strlen(acStack_408);
      if (sVar3 != 0) {
        openjtalk_speakSync(local_8,acStack_408);
      }
    }
    fclose(local_10);
    return;
  }
  exit(1);
}

Assistant:

void speak_file(OpenJTalk *openjtalk, FILE* fp)
{
	char line[MAX_LENGTH + 1];

	if (fp == NULL)
	{
		exit(EXIT_FAILURE);
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		openjtalk_speakSync(openjtalk, line);
	}
	fclose(fp);
}